

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_deserializer.cpp
# Opt level: O3

string * __thiscall
duckdb::BinaryDeserializer::ReadString_abi_cxx11_
          (string *__return_storage_ptr__,BinaryDeserializer *this)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  
  uVar1 = VarIntDecode<unsigned_int>(this);
  if (uVar1 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    uVar3 = (ulong)uVar1;
    pvVar2 = operator_new__(uVar3);
    (**this->stream->_vptr_ReadStream)(this->stream,pvVar2,uVar3);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pvVar2,(long)pvVar2 + uVar3);
    operator_delete__(pvVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

string BinaryDeserializer::ReadString() {
	auto len = VarIntDecode<uint32_t>();
	if (len == 0) {
		return string();
	}
	auto buffer = make_unsafe_uniq_array_uninitialized<data_t>(len);
	ReadData(buffer.get(), len);
	return string(const_char_ptr_cast(buffer.get()), len);
}